

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
* __thiscall
ising::free_energy::square::
finite_count<unsigned_int,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,0ul>>
          (promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
           *__return_storage_ptr__,square *this,uint Lx,uint Ly,
          mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *Jy,fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                  *beta,
          fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
          h)

{
  uint uVar1;
  long lVar2;
  invalid_argument *piVar3;
  undefined4 in_register_0000000c;
  uint v;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *extraout_RDX;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *cr;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *cr_00;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *extraout_RDX_00;
  int_t s;
  uint uVar4;
  ulong uVar5;
  vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  J;
  unitcell unitcell;
  graph graph;
  basis basis;
  real_t energy;
  real_t mag;
  real_t gs_energy;
  value_t Z;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_848;
  real_t cj;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  local_618;
  real_t ci;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  local_228;
  
  if (((int)this != 0) && (Lx != 0)) {
    lattice::basis::simple(&basis,2);
    unitcell.dim_ = 2;
    unitcell.sites_.
    super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unitcell.sites_.
    super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unitcell.sites_.
    super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unitcell.bonds_.
    super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unitcell.bonds_.
    super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unitcell.bonds_.
    super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lattice::coordinate((lattice *)&Z,0.0,0.0);
    lattice::unitcell::add_site(&unitcell,(coordinate_t *)&Z,0);
    free((void *)Z.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems._0_8_);
    lattice::offset((lattice *)&Z,1,0);
    lattice::unitcell::add_bond(&unitcell,0,0,(offset_t *)&Z,0);
    free((void *)Z.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems._0_8_);
    lattice::offset((lattice *)&Z,0,1);
    lattice::unitcell::add_bond(&unitcell,0,0,(offset_t *)&Z,1);
    free((void *)Z.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems._0_8_);
    lattice::extent((span_t *)&Z,(ulong)this & 0xffffffff,(ulong)Lx);
    lattice::graph::graph(&graph,&basis,&unitcell,(span_t *)&Z,periodic);
    free((void *)Z.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems._0_8_);
    if ((ulong)(((long)graph.sites_.
                       super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)graph.sites_.
                      super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38) < 0x20) {
      std::
      vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
      ::vector(&J,2,(allocator_type *)&Z);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 J.
                 super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (cpp_dec_float<50U,_int,_void> *)CONCAT44(in_register_0000000c,Ly));
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 (J.
                  super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1),(cpp_dec_float<50U,_int,_void> *)Jx
                );
      ::operator+(&ci,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_register_0000000c,Ly),Jx);
      ::operator-((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&Z,&ci);
      v = Lx * (int)this;
      ::operator*(&gs_energy,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&Z,v);
      lVar2 = (long)graph.sites_.
                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)graph.sites_.
                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      ci.base.m_backend.data._M_elems[0] = 0;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
      ::fvar<int>(&Z,(int *)&ci);
      cr = extraout_RDX;
      for (uVar1 = 0; uVar1 >> ((byte)(lVar2 / 0x38) & 0x1f) == 0; uVar1 = uVar1 + 1) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<50U,_int,_void> *)&energy,0,(type *)0x0);
        uVar4 = 0;
        while( true ) {
          uVar5 = (ulong)uVar4;
          if ((ulong)(((long)graph.bonds_.
                             super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)graph.bonds_.
                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar5) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)&local_228,2,(type *)0x0);
          ::operator*(&cj,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)&local_228,
                      (uint)((uVar1 >> ((uint)graph.bonds_.
                                              super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                              source & 0x1f) & 1) != 0));
          ::operator-((type *)&ci,&cj,1);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)&local_618,2,(type *)0x0);
          ::operator*((type *)&local_228,
                      (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_618,
                      (uint)((uVar1 >> ((uint)graph.bonds_.
                                              super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                              target & 0x1f) & 1) != 0));
          ::operator-(&cj,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)&local_228,1);
          ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_618,
                      J.
                      super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      graph.bonds_.
                      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar5].type,
                      (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&ci);
          ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_228,
                      (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_618,&cj);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)&energy,
                     (cpp_dec_float<50U,_int,_void> *)&local_228);
          uVar4 = uVar4 + 1;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<50U,_int,_void> *)&mag,0,(type *)0x0);
        uVar5 = 0;
        while( true ) {
          if ((ulong)(((long)graph.sites_.
                             super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)graph.sites_.
                            super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar5) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)&local_228,2,(type *)0x0);
          ::operator*(&cj,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)&local_228,(uint)((uVar1 >> ((uint)uVar5 & 0x1f) & 1) != 0));
          ::operator-((type *)&ci,&cj,1);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    ((cpp_dec_float<50U,_int,_void> *)&mag,(cpp_dec_float<50U,_int,_void> *)&ci);
          uVar5 = (ulong)((uint)uVar5 + 1);
        }
        ::operator-(&local_848,&gs_energy,&energy);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
        ::operator*((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                     *)&local_618,
                    (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                     *)beta,&mag);
        boost::math::differentiation::autodiff_v1::detail::operator-
                  ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                    *)&local_228,&local_848,
                   (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                    *)&local_618);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,0ul>
        ::operator*((promote<fvar<fvar<mp_wrapper<number<cpp_dec_float<50U>_>_>,_2UL>,_0UL>,_fvar<mp_wrapper<number<cpp_dec_float<50U,_int,_void>,_(expression_template_option)1>_>,_2UL>_>
                     *)&cj,(fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,0ul>
                            *)&local_228,
                    (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                     *)Jy);
        boost::math::differentiation::autodiff_v1::detail::
        exp<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                  ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                    *)&ci,(detail *)&cj,cr_00);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
        ::operator+=((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                      *)&Z,(fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                            *)&ci);
        cr = extraout_RDX_00;
      }
      boost::math::differentiation::autodiff_v1::detail::
      log<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                (&local_618,(detail *)&Z,cr);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
      ::operator-(&local_228,&local_618);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
      ::operator/((promote<fvar<fvar<mp_wrapper<number<cpp_dec_float<50U>_>_>,_2UL>,_2UL>,_fvar<mp_wrapper<number<cpp_dec_float<50U,_int,_void>,_(expression_template_option)1>_>,_2UL>_>
                   *)&cj,(fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                          *)&local_228,
                  (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                   *)Jy);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
      ::operator+((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                   *)&ci,(fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                          *)&cj,&gs_energy);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
      cpp_dec_float<unsigned_long_long>
                ((cpp_dec_float<50U,_int,_void> *)&energy,(ulong)v,(type *)0x0);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
      ::operator/(__return_storage_ptr__,
                  (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                   *)&ci,&energy);
      std::
      _Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
      ::~_Vector_base(&J.
                       super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                     );
      lattice::graph::~graph(&graph);
      lattice::unitcell::~unitcell(&unitcell);
      free(basis.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      return __return_storage_ptr__;
    }
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"too large system size");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Lx and Ly should be positive");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline boost::math::differentiation::promote<U, W> finite_count(I Lx, I Ly,
                                                                T Jx, T Jy,
                                                                U beta, W h) {
  typedef I int_t;
  typedef T real_t;
  typedef boost::math::differentiation::promote<U, W> value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));

  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 1);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_sites() >= 32)
    throw(std::invalid_argument("too large system size"));

  std::vector<real_t> J(2);
  J[0] = Jx;
  J[1] = Jy;
  real_t gs_energy = -(Jx + Jy) * (Lx * Ly);
  int_t num_states = 1 << graph.num_sites();
  value_t Z(0);
  for (int_t c = 0; c < num_states; ++c) {
    real_t energy = 0;
    for (int_t b = 0; b < graph.num_bonds(); ++b) {
      real_t ci = real_t(2) * ((c >> graph.source(b)) & 1) - 1;
      real_t cj = real_t(2) * ((c >> graph.target(b)) & 1) - 1;
      energy -= J[graph.bond_type(b)] * ci * cj;
    }
    real_t mag = 0;
    for (int_t s = 0; s < graph.num_sites(); ++s) {
      mag += real_t(2) * ((c >> s) & 1) - 1;
    }
    Z += exp((gs_energy - energy - h * mag) * beta);
  }
  return (-log(Z) / beta + gs_energy) / (Lx * Ly);
}